

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void ppc_cpu_reset(CPUState *dev)

{
  TranslationBlock *pTVar1;
  long lVar2;
  uint uVar3;
  int alter_hv;
  uint uVar4;
  uint uVar5;
  target_ulong value;
  bool bVar6;
  
  (*(code *)dev[3].tb_jmp_cache[0xa5e])();
  value = 0x9000000000000040;
  if ((*(uint *)(dev[3].tb_jmp_cache + 0x8d8) >> 0x10 & 1) == 0) {
    value = 0x1000000000000040;
  }
  hreg_store_msr((CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359),value,alter_hv);
  dev[1].tb_jmp_cache[0x3ae] =
       (TranslationBlock *)((ulong)dev[3].tb_jmp_cache[0x946] | (ulong)dev[3].tb_jmp_cache[0x949]);
  bVar6 = true;
  if (*(int *)(dev[3].tb_jmp_cache + 0x8d8) != 6) {
    ppc_tlb_invalidate_all_ppc64((CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359));
    bVar6 = ((ulong)dev[3].tb_jmp_cache[0x8d8] & 8) == 0;
  }
  pTVar1 = dev[1].tb_jmp_cache[0x3a9];
  uVar4 = (uint)(((uint)pTVar1 >> 0xe & 1) == 0);
  uVar3 = (uint)((ulong)pTVar1 >> 4) & 2 | uVar4;
  if (bVar6) {
    uVar3 = uVar3 ^ 2;
    uVar4 = ((uint)((ulong)pTVar1 >> 3) & 2 | uVar4) ^ 2;
    uVar5 = (uint)((ulong)pTVar1 >> 0x3a);
  }
  else {
    uVar4 = (uint)((ulong)pTVar1 >> 3) & 2 | uVar4;
    uVar5 = (uint)((ulong)pTVar1 >> 0x1a) & 0x3f;
  }
  *(uint *)(dev[3].tb_jmp_cache + 0x94e) = uVar3 | uVar5 & 4;
  *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar5 & 4 | uVar4;
  dev[3].tb_jmp_cache[0x94c] =
       (TranslationBlock *)((ulong)pTVar1 & 0x9000000082c06631 | (ulong)dev[3].tb_jmp_cache[0x94d]);
  dev[1].tb_jmp_cache[0x3a6] = (TranslationBlock *)0xffffffffffffffff;
  dev->exception_index = -1;
  dev[3].tb_jmp_cache[0x8dd] = (TranslationBlock *)0x0;
  ppc_irq_reset_ppc64((PowerPCCPU_conflict3 *)dev);
  *(undefined1 *)((long)dev[3].tb_jmp_cache + 0x468c) = 1;
  lVar2 = 0;
  do {
    if (dev[1].tb_jmp_cache[lVar2 + 0x8c2] != (TranslationBlock *)0x0) {
      *(TranslationBlock **)((long)dev[1].tb_jmp_cache + lVar2 + 0x25e0) =
           dev[1].tb_jmp_cache[lVar2 + 0x8c3];
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x2000);
  return;
}

Assistant:

static void ppc_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    PowerPCCPU *cpu = POWERPC_CPU(s);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong msr;
    int i;

    pcc->parent_reset(dev);

    msr = (target_ulong)0;
    msr |= (target_ulong)MSR_HVB;
    msr |= (target_ulong)0 << MSR_AP; /* TO BE CHECKED */
    msr |= (target_ulong)0 << MSR_SA; /* TO BE CHECKED */
    msr |= (target_ulong)1 << MSR_EP;
#if defined(DO_SINGLE_STEP) && 0
    /* Single step trace mode */
    msr |= (target_ulong)1 << MSR_SE;
    msr |= (target_ulong)1 << MSR_BE;
#endif

#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        msr |= (1ULL << MSR_SF);
    }
#endif

    hreg_store_msr(env, msr, 1);

    env->nip = env->hreset_vector | env->excp_prefix;
    if (env->mmu_model != POWERPC_MMU_REAL) {
        ppc_tlb_invalidate_all(env);
    }

    hreg_compute_hflags(env);
#ifdef _MSC_VER
    env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
    env->reserve_addr = (target_ulong)-1ULL;
#endif
    /* Be sure no exception or interrupt is pending */
    env->pending_interrupts = 0;
    s->exception_index = POWERPC_EXCP_NONE;
    env->error_code = 0;
    ppc_irq_reset(cpu);

    /* tininess for underflow is detected before rounding */
    set_float_detect_tininess(float_tininess_before_rounding,
                              &env->fp_status);

    for (i = 0; i < ARRAY_SIZE(env->spr_cb); i++) {
        ppc_spr_t *spr = &env->spr_cb[i];

        if (!spr->name) {
            continue;
        }
        env->spr[i] = spr->default_value;
    }
}